

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O0

void c140_alloc_rom(void *chip,UINT32 memsize)

{
  UINT32 UVar1;
  void *pvVar2;
  c140_state *info;
  UINT32 memsize_local;
  void *chip_local;
  
  if (*(UINT32 *)((long)chip + 0x18) != memsize) {
    pvVar2 = realloc(*(void **)((long)chip + 0x20),(ulong)memsize);
    *(void **)((long)chip + 0x20) = pvVar2;
    *(UINT32 *)((long)chip + 0x18) = memsize;
    UVar1 = pow2_mask(memsize);
    *(UINT32 *)((long)chip + 0x1c) = UVar1;
    memset(*(void **)((long)chip + 0x20),0xff,(ulong)memsize);
  }
  return;
}

Assistant:

static void c140_alloc_rom(void* chip, UINT32 memsize)
{
	c140_state *info = (c140_state *)chip;
	
	if (info->romSize == memsize)
		return;
	
	info->pRom = (UINT8*)realloc(info->pRom, memsize);
	info->romSize = memsize;
	info->romMask = pow2_mask(memsize);
	memset(info->pRom, 0xFF, memsize);
	
	return;
}